

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

Vector<float,_1> __thiscall tcu::normalize<float,1>(tcu *this,Vector<float,_1> *a)

{
  Type TVar1;
  float extraout_XMM0_Da [1];
  Vector<float,_1> VVar2;
  int local_20;
  int i;
  float ooLen;
  Vector<float,_1> *a_local;
  Vector<float,_1> *res;
  
  TVar1 = length<float,1>(a);
  Vector<float,_1>::Vector((Vector<float,_1> *)this);
  VVar2.m_data[0] = (float  [1])(float  [1])extraout_XMM0_Da[0];
  for (local_20 = 0; local_20 < 1; local_20 = local_20 + 1) {
    VVar2.m_data[0] = (float  [1])((1.0 / TVar1) * a[local_20].m_data[0]);
    *(float (*) [1])(this + (long)local_20 * 4) = VVar2.m_data[0];
  }
  return (Vector<float,_1>)VVar2.m_data[0];
}

Assistant:

inline Vector<T, Size> normalize (const Vector<T, Size>& a)
{
	T ooLen = T(1) / length(a);
	Vector<T, Size> res;
	for (int i = 0; i < Size; i++)
		res.m_data[i] = ooLen * a.m_data[i];
	return res;
}